

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

uint http2_conncheck(Curl_easy *data,connectdata *conn,uint checks_to_perform)

{
  undefined8 uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  uint uVar4;
  timediff_t tVar5;
  char *pcVar6;
  curltime cVar7;
  curltime newer;
  curltime older;
  timediff_t elapsed;
  curltime now;
  _Bool send_frames;
  int rc;
  http_conn *c;
  uint ret_val;
  uint checks_to_perform_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  c._0_4_ = 0;
  now.tv_usec._3_1_ = false;
  if ((checks_to_perform & 1) != 0) {
    _Var3 = http2_connisdead(data,conn);
    c._0_4_ = (uint)_Var3;
  }
  if ((checks_to_perform & 2) != 0) {
    cVar7 = Curl_now();
    uVar1 = (conn->keepalive).tv_sec;
    uVar2 = (conn->keepalive).tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar7._0_12_,0);
    newer.tv_usec = SUB124(cVar7._0_12_,8);
    older._12_4_ = 0;
    tVar5 = Curl_timediff(newer,older);
    if ((data->set).upkeep_interval_ms < tVar5) {
      uVar4 = nghttp2_submit_ping((conn->proto).httpc.h2,'\0',(uint8_t *)0x0);
      if (uVar4 != 0) {
        pcVar6 = nghttp2_strerror(uVar4);
        Curl_failf(data,"nghttp2_submit_ping() failed: %s(%d)",pcVar6,(ulong)uVar4);
      }
      now.tv_usec._3_1_ = uVar4 == 0;
      (conn->keepalive).tv_sec = cVar7.tv_sec;
      *(ulong *)&(conn->keepalive).tv_usec = CONCAT44(now.tv_sec._4_4_,cVar7.tv_usec);
    }
  }
  if (now.tv_usec._3_1_) {
    set_transfer(&(conn->proto).httpc,data);
    uVar4 = nghttp2_session_send((conn->proto).httpc.h2);
    if (uVar4 != 0) {
      pcVar6 = nghttp2_strerror(uVar4);
      Curl_failf(data,"nghttp2_session_send() failed: %s(%d)",pcVar6,(ulong)uVar4);
    }
  }
  return (uint)c;
}

Assistant:

static unsigned int http2_conncheck(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    unsigned int checks_to_perform)
{
  unsigned int ret_val = CONNRESULT_NONE;
  struct http_conn *c = &conn->proto.httpc;
  int rc;
  bool send_frames = false;

  if(checks_to_perform & CONNCHECK_ISDEAD) {
    if(http2_connisdead(data, conn))
      ret_val |= CONNRESULT_DEAD;
  }

  if(checks_to_perform & CONNCHECK_KEEPALIVE) {
    struct curltime now = Curl_now();
    timediff_t elapsed = Curl_timediff(now, conn->keepalive);

    if(elapsed > data->set.upkeep_interval_ms) {
      /* Perform an HTTP/2 PING */
      rc = nghttp2_submit_ping(c->h2, 0, ZERO_NULL);
      if(!rc) {
        /* Successfully added a PING frame to the session. Need to flag this
           so the frame is sent. */
        send_frames = true;
      }
      else {
       failf(data, "nghttp2_submit_ping() failed: %s(%d)",
             nghttp2_strerror(rc), rc);
      }

      conn->keepalive = now;
    }
  }

  if(send_frames) {
    set_transfer(c, data); /* set the transfer */
    rc = nghttp2_session_send(c->h2);
    if(rc)
      failf(data, "nghttp2_session_send() failed: %s(%d)",
            nghttp2_strerror(rc), rc);
  }

  return ret_val;
}